

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModbusAnalyzerSettings.cpp
# Opt level: O0

void __thiscall ModbusAnalyzerSettings::ModbusAnalyzerSettings(ModbusAnalyzerSettings *this)

{
  AnalyzerSettingInterfaceNumberList *pAVar1;
  element_type *peVar2;
  AnalyzerSettingInterfaceChannel *this_00;
  element_type *peVar3;
  AnalyzerSettingInterfaceInteger *this_01;
  element_type *peVar4;
  char *pcVar5;
  Channel *pCVar6;
  ulong uVar7;
  uint uVar8;
  ModbusAnalyzerSettings *this_local;
  
  AnalyzerSettings::AnalyzerSettings(&this->super_AnalyzerSettings);
  *(undefined ***)this = &PTR__ModbusAnalyzerSettings_00134d68;
  Channel::Channel(&this->mInputChannel,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  this->mBitRate = 0x2580;
  this->mBitsPerTransfer = 8;
  this->mShiftOrder = LsbFirst;
  this->mParity = EvenOne;
  this->mInverted = false;
  this->mUseAutobaud = false;
  this->mModbusMode = ModbusRTUClient;
  std::auto_ptr<AnalyzerSettingInterfaceChannel>::auto_ptr
            (&this->mInputChannelInterface,(element_type *)0x0);
  std::auto_ptr<AnalyzerSettingInterfaceInteger>::auto_ptr
            (&this->mBitRateInterface,(element_type *)0x0);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::auto_ptr
            (&this->mBitsPerTransferInterface,(element_type *)0x0);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::auto_ptr
            (&this->mShiftOrderInterface,(element_type *)0x0);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::auto_ptr
            (&this->mParityInterface,(element_type *)0x0);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::auto_ptr
            (&this->mInvertedInterface,(element_type *)0x0);
  std::auto_ptr<AnalyzerSettingInterfaceBool>::auto_ptr
            (&this->mUseAutobaudInterface,(element_type *)0x0);
  uVar7 = 0;
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::auto_ptr
            (&this->mModbusModeInterface,(element_type *)0x0);
  pAVar1 = (AnalyzerSettingInterfaceNumberList *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,uVar7);
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList(pAVar1);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::reset(&this->mParityInterface,pAVar1);
  peVar2 = std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->(&this->mParityInterface);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)peVar2,"Parity Bit");
  peVar2 = std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->(&this->mParityInterface);
  AnalyzerSettingInterfaceNumberList::AddNumber(1.0,(char *)peVar2,"Even Parity Bit (default)");
  peVar2 = std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->(&this->mParityInterface);
  AnalyzerSettingInterfaceNumberList::AddNumber(2.0,(char *)peVar2,"Odd Parity Bit");
  peVar2 = std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->(&this->mParityInterface);
  AnalyzerSettingInterfaceNumberList::AddNumber(0.0,(char *)peVar2,"No Parity Bit, 2 stop bits");
  peVar2 = std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->(&this->mParityInterface);
  pcVar5 = "No Parity Bit, 1 stop bit";
  AnalyzerSettingInterfaceNumberList::AddNumber(3.0,(char *)peVar2,"No Parity Bit, 1 stop bit");
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->(&this->mParityInterface);
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mParity);
  this_00 = (AnalyzerSettingInterfaceChannel *)
            AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pcVar5);
  AnalyzerSettingInterfaceChannel::AnalyzerSettingInterfaceChannel(this_00);
  std::auto_ptr<AnalyzerSettingInterfaceChannel>::reset(&this->mInputChannelInterface,this_00);
  peVar3 = std::auto_ptr<AnalyzerSettingInterfaceChannel>::operator->(&this->mInputChannelInterface)
  ;
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)peVar3,"Modbus");
  peVar3 = std::auto_ptr<AnalyzerSettingInterfaceChannel>::operator->(&this->mInputChannelInterface)
  ;
  pCVar6 = &this->mInputChannel;
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)peVar3);
  pAVar1 = (AnalyzerSettingInterfaceNumberList *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pCVar6);
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList(pAVar1);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::reset(&this->mModbusModeInterface,pAVar1);
  peVar2 = std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->
                     (&this->mModbusModeInterface);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)peVar2,"Modbus Mode");
  peVar2 = std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->
                     (&this->mModbusModeInterface);
  AnalyzerSettingInterfaceNumberList::AddNumber(0.0,(char *)peVar2,"RTU - Client");
  peVar2 = std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->
                     (&this->mModbusModeInterface);
  AnalyzerSettingInterfaceNumberList::AddNumber(1.0,(char *)peVar2,"RTU - Server");
  peVar2 = std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->
                     (&this->mModbusModeInterface);
  AnalyzerSettingInterfaceNumberList::AddNumber(2.0,(char *)peVar2,"ASCII - Client");
  peVar2 = std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->
                     (&this->mModbusModeInterface);
  pcVar5 = "ASCII - Server";
  AnalyzerSettingInterfaceNumberList::AddNumber(3.0,(char *)peVar2,"ASCII - Server");
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->(&this->mModbusModeInterface);
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mModbusMode);
  this_01 = (AnalyzerSettingInterfaceInteger *)
            AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pcVar5);
  AnalyzerSettingInterfaceInteger::AnalyzerSettingInterfaceInteger(this_01);
  std::auto_ptr<AnalyzerSettingInterfaceInteger>::reset(&this->mBitRateInterface,this_01);
  peVar4 = std::auto_ptr<AnalyzerSettingInterfaceInteger>::operator->(&this->mBitRateInterface);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)peVar4,"Bit Rate (Bits/s)");
  peVar4 = std::auto_ptr<AnalyzerSettingInterfaceInteger>::operator->(&this->mBitRateInterface);
  AnalyzerSettingInterfaceInteger::SetMax((int)peVar4);
  peVar4 = std::auto_ptr<AnalyzerSettingInterfaceInteger>::operator->(&this->mBitRateInterface);
  AnalyzerSettingInterfaceInteger::SetMin((int)peVar4);
  peVar4 = std::auto_ptr<AnalyzerSettingInterfaceInteger>::operator->(&this->mBitRateInterface);
  uVar7 = (ulong)this->mBitRate;
  AnalyzerSettingInterfaceInteger::SetInteger((int)peVar4);
  pAVar1 = (AnalyzerSettingInterfaceNumberList *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,uVar7);
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList(pAVar1);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::reset(&this->mInvertedInterface,pAVar1);
  peVar2 = std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->(&this->mInvertedInterface);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)peVar2,"Signal Inversion");
  peVar2 = std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->(&this->mInvertedInterface);
  AnalyzerSettingInterfaceNumberList::AddNumber(0.0,(char *)peVar2,"Non Inverted (Standard)");
  peVar2 = std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->(&this->mInvertedInterface);
  AnalyzerSettingInterfaceNumberList::AddNumber(1.0,(char *)peVar2,"Inverted");
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->(&this->mInvertedInterface);
  AnalyzerSettingInterfaceNumberList::SetNumber((double)(this->mInverted & 1));
  std::auto_ptr<AnalyzerSettingInterfaceChannel>::get(&this->mInputChannelInterface);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::get(&this->mModbusModeInterface);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  std::auto_ptr<AnalyzerSettingInterfaceInteger>::get(&this->mBitRateInterface);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::get(&this->mInvertedInterface);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::get(&this->mParityInterface);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  uVar8 = (uint)this;
  AnalyzerSettings::AddExportOption(uVar8,(char *)0x0);
  AnalyzerSettings::AddExportExtension(uVar8,(char *)0x0,"text");
  AnalyzerSettings::AddExportExtension(uVar8,(char *)0x0,"csv");
  AnalyzerSettings::ClearChannels();
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mInputChannel,true);
  return;
}

Assistant:

ModbusAnalyzerSettings::ModbusAnalyzerSettings()
    : mInputChannel( UNDEFINED_CHANNEL ),
      mBitRate( 9600 ),
      mBitsPerTransfer( 8 ),
      mShiftOrder( AnalyzerEnums::LsbFirst ),
      mParity( ModbusAnalyzerEnums::ParityAndStopbits::EvenOne ),
      mInverted( false ),
      mUseAutobaud( false ),
      mModbusMode( ModbusAnalyzerEnums::ModbusRTUClient )
{
    mParityInterface.reset( new AnalyzerSettingInterfaceNumberList() );
    mParityInterface->SetTitleAndTooltip( "Parity Bit", "Specify None, Even, or Odd Parity" );
    mParityInterface->AddNumber( ModbusAnalyzerEnums::ParityAndStopbits::EvenOne, "Even Parity Bit (default)", "" );
    mParityInterface->AddNumber( ModbusAnalyzerEnums::ParityAndStopbits::OddOne, "Odd Parity Bit", "" );
    mParityInterface->AddNumber( ModbusAnalyzerEnums::ParityAndStopbits::NoneTwo, "No Parity Bit, 2 stop bits", "" );
    mParityInterface->AddNumber( ModbusAnalyzerEnums::ParityAndStopbits::NoneOne, "No Parity Bit, 1 stop bit", "" );
    mParityInterface->SetNumber( mParity );


    mInputChannelInterface.reset( new AnalyzerSettingInterfaceChannel() );
    mInputChannelInterface->SetTitleAndTooltip( "Modbus",
                                                "Modbus" ); // Todo: Change to reflect specific variant of Modbus later in program.
    mInputChannelInterface->SetChannel( mInputChannel );


    mModbusModeInterface.reset( new AnalyzerSettingInterfaceNumberList() );
    mModbusModeInterface->SetTitleAndTooltip( "Modbus Mode", "Specify which mode of Modbus this is" );
    mModbusModeInterface->AddNumber( ModbusAnalyzerEnums::ModbusRTUClient, "RTU - Client", "Messages are transmitted in binary" );
    mModbusModeInterface->AddNumber( ModbusAnalyzerEnums::ModbusRTUServer, "RTU - Server", "Messages are transmitted in binary" );
    mModbusModeInterface->AddNumber( ModbusAnalyzerEnums::ModbusASCIIClient, "ASCII - Client",
                                     "Messages are transmitted in ASCII-readable format" );
    mModbusModeInterface->AddNumber( ModbusAnalyzerEnums::ModbusASCIIServer, "ASCII - Server",
                                     "Messages are transmitted in ASCII-readable format" );
    mModbusModeInterface->SetNumber( mModbusMode );


    mBitRateInterface.reset( new AnalyzerSettingInterfaceInteger() );
    mBitRateInterface->SetTitleAndTooltip( "Bit Rate (Bits/s)", "" );
    mBitRateInterface->SetMax( 6000000 );
    mBitRateInterface->SetMin( 1 );
    mBitRateInterface->SetInteger( mBitRate );


    mInvertedInterface.reset( new AnalyzerSettingInterfaceNumberList() );
    mInvertedInterface->SetTitleAndTooltip( "Signal Inversion", "Specify if the serial signal is inverted" );
    mInvertedInterface->AddNumber( false, "Non Inverted (Standard)", "" );
    mInvertedInterface->AddNumber( true, "Inverted", "" );
    mInvertedInterface->SetNumber( mInverted );
    enum Mode
    {
        Normal,
        MpModeRightZeroMeansAddress,
        MpModeRightOneMeansAddress,
        MpModeLeftZeroMeansAddress,
        MpModeLeftOneMeansAddress
    }; // FIXME: unused?


    AddInterface( mInputChannelInterface.get() );
    AddInterface( mModbusModeInterface.get() );
    AddInterface( mBitRateInterface.get() );
    AddInterface( mInvertedInterface.get() );
    AddInterface( mParityInterface.get() );


    // AddExportOption( 0, "Export as text/csv file", "text (*.txt);;csv (*.csv)" );
    AddExportOption( 0, "Export as text/csv file" );
    AddExportExtension( 0, "text", "txt" );
    AddExportExtension( 0, "csv", "csv" );

    ClearChannels();
    AddChannel( mInputChannel, "Modbus", false );
}